

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (string *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestInfo *test_info;
  string local_b0;
  CodeLocation local_90;
  TypeId local_68;
  string local_60;
  TestInfo *local_40;
  allocator<char> local_31;
  
  local_68 = fixture_class_id;
  local_40 = (TestInfo *)operator_new(0x110);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(test_suite_name->_M_dataplus)._M_p;
  paVar1 = &test_suite_name->field_2;
  if (paVar2 == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&test_suite_name->field_2 + 8);
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60._M_dataplus._M_p = (pointer)paVar2;
  }
  local_60._M_string_length = test_suite_name->_M_string_length;
  (test_suite_name->_M_dataplus)._M_p = (pointer)paVar1;
  test_suite_name->_M_string_length = 0;
  (test_suite_name->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,name,&local_31);
  test_info = local_40;
  paVar1 = &local_90.file.field_2;
  local_90.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar2 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.file._M_dataplus._M_p == paVar2) {
    local_90.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_90.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_90.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_90.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar2;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_90.line = code_location->line;
  TestInfo::TestInfo(local_40,&local_60,&local_b0,type_param,value_param,&local_90,local_68,factory)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.file._M_dataplus._M_p,local_90.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,set_up_tc,tear_down_tc,test_info);
  return test_info;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    std::string test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(std::move(test_suite_name), name, type_param, value_param,
                   std::move(code_location), fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}